

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringpiece.cpp
# Opt level: O0

void __thiscall icu_63::StringPiece::StringPiece(StringPiece *this,StringPiece *x,int32_t pos)

{
  int local_1c;
  int32_t pos_local;
  StringPiece *x_local;
  StringPiece *this_local;
  
  if (pos < 0) {
    local_1c = 0;
  }
  else {
    local_1c = pos;
    if (x->length_ < pos) {
      local_1c = x->length_;
    }
  }
  this->ptr_ = x->ptr_ + local_1c;
  this->length_ = x->length_ - local_1c;
  return;
}

Assistant:

StringPiece::StringPiece(const StringPiece& x, int32_t pos) {
  if (pos < 0) {
    pos = 0;
  } else if (pos > x.length_) {
    pos = x.length_;
  }
  ptr_ = x.ptr_ + pos;
  length_ = x.length_ - pos;
}